

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

void Abc_NtkRecLibMerge3(Gia_Man_t *pLib)

{
  word *pTruth;
  Gia_Man_t *p;
  Lms_Man_t *pLVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iLit1;
  abctime aVar6;
  Vec_Str_t *p_00;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  word *t;
  abctime aVar9;
  Gia_Obj_t *pGVar10;
  uint nVars;
  int i;
  Vec_Int_t *p_01;
  ulong uVar11;
  int v;
  char pCanonPerm [16];
  
  pLVar1 = s_pMan3;
  p = s_pMan3->pGia;
  aVar6 = Abc_Clock();
  if (pLib->vCis->nSize != p->vCis->nSize) {
    printf("The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n");
    return;
  }
  if ((p->vHTable).nSize == 0) {
    Gia_ManHashStart(p);
  }
  p_00 = Lms_GiaSuppSizes(pLib);
  pTruth = pLVar1->pTemp1;
  v = 0;
  pGVar10 = (Gia_Obj_t *)0x0;
  do {
    if ((pLib->vCos->nSize <= v) || (pGVar7 = Gia_ManCo(pLib,v), pGVar7 == (Gia_Obj_t *)0x0)) {
      Vec_StrFree(p_00);
      aVar8 = Abc_Clock();
      pLVar1->timeTotal = pLVar1->timeTotal + (aVar8 - aVar6);
      return;
    }
    cVar2 = Vec_StrEntry(p_00,v);
    if (cVar2 < '\x02') {
      __assert_fail("nLeaves > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x255,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
    }
    nVars = (uint)cVar2;
    aVar8 = Abc_Clock();
    t = Gia_ObjComputeTruthTable(pLib,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff));
    aVar9 = Abc_Clock();
    pLVar1->timeTruth = pLVar1->timeTruth + (aVar9 - aVar8);
    aVar8 = Abc_Clock();
    memcpy(pTruth,t,(long)pLVar1->nWords << 3);
    uVar3 = Abc_TtCanonicize(pTruth,nVars,pCanonPerm);
    Abc_TtStretch5((uint *)pTruth,nVars,pLVar1->nVars);
    aVar9 = Abc_Clock();
    pLVar1->timeCanon = pLVar1->timeCanon + (aVar9 - aVar8);
    if ((cVar2 != '\x02') || (iVar4 = Abc_TtSupportSize(t,2), iVar4 == 2)) {
      aVar8 = Abc_Clock();
      for (uVar11 = 0; nVars != uVar11; uVar11 = uVar11 + 1) {
        pGVar7 = Gia_ManPi(p,(uint)uVar11);
        iVar4 = Gia_ObjId(p,pGVar7);
        uVar5 = Abc_Var2Lit(iVar4,(uint)((uVar3 >> ((uint)uVar11 & 0x1f) & 1) != 0));
        pGVar7 = Gia_ManCi(pLib,(int)pCanonPerm[uVar11]);
        pGVar7->Value = uVar5;
      }
      p_01 = pLib->vTtNodes;
      iVar4 = p_01->nSize;
      if (iVar4 < 1) {
        __assert_fail("Vec_IntSize(pLib->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x26e,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
      }
      for (i = 0; i < iVar4; i = i + 1) {
        iVar4 = Vec_IntEntry(p_01,i);
        pGVar10 = Gia_ManObj(pLib,iVar4);
        if (pGVar10 == (Gia_Obj_t *)0x0) {
          pGVar10 = (Gia_Obj_t *)0x0;
          break;
        }
        iVar4 = Abc_LitNotCond(pGVar10[-(*(ulong *)pGVar10 & 0x1fffffff)].Value,
                               (uint)(*(ulong *)pGVar10 >> 0x1d) & 1);
        iLit1 = Abc_LitNotCond(pGVar10[-(*(ulong *)pGVar10 >> 0x20 & 0x1fffffff)].Value,
                               (uint)(*(ulong *)pGVar10 >> 0x3d) & 1);
        uVar5 = Gia_ManHashAnd(p,iVar4,iLit1);
        pGVar10->Value = uVar5;
        p_01 = pLib->vTtNodes;
        iVar4 = p_01->nSize;
      }
      aVar9 = Abc_Clock();
      pLVar1->timeBuild = pLVar1->timeBuild + (aVar9 - aVar8);
      if (((int)(uint)*(undefined8 *)pGVar10 < 0) ||
         (((uint)*(undefined8 *)pGVar10 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x278,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
      }
      iVar4 = Abc_Lit2Var(pGVar10->Value);
      pGVar7 = Gia_ManObj(p,iVar4);
      if ((*(ulong *)pGVar7 & 0x4000000000000000) == 0) {
        *(ulong *)pGVar7 = *(ulong *)pGVar7 | 0x4000000000000000;
        iVar4 = Abc_LitNotCond(pGVar10->Value,(uint)((uVar3 >> (nVars & 0x1f) & 1) != 0));
        Gia_ManAppendCo(p,iVar4);
        aVar8 = Abc_Clock();
        iVar4 = Vec_MemHashInsert(pLVar1->vTtMem,pTruth);
        Vec_IntPush(pLVar1->vTruthIds,iVar4);
        if (p->vCos->nSize != pLVar1->vTruthIds->nSize) {
          __assert_fail("Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0x29f,"void Abc_NtkRecLibMerge3(Gia_Man_t *)");
        }
        pLVar1->nAdded = pLVar1->nAdded + 1;
        aVar9 = Abc_Clock();
        pLVar1->timeInsert = pLVar1->timeInsert + (aVar9 - aVar8);
      }
      else {
        pLVar1->nFilterSame = pLVar1->nFilterSame + 1;
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Abc_NtkRecLibMerge3( Gia_Man_t * pLib )
{
    int fCheck = 0;
    Lms_Man_t * p = s_pMan3;
    Gia_Man_t * pGia = p->pGia;
    Vec_Str_t * vSupps;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    word * pTruth;
    int i, k, Index, iFanin0, iFanin1, nLeaves;
    Gia_Obj_t * pObjPo, * pDriver, * pTemp = NULL;
    abctime clk, clk2 = Abc_Clock();

    if ( Gia_ManCiNum(pLib) != Gia_ManCiNum(pGia) )
    {
        printf( "The number of Library inputs (%d) differs from the number of Gia inputs (%d).\n", Gia_ManCiNum(pLib), Gia_ManCiNum(pGia) );
        return;
    }
    assert( Gia_ManCiNum(pLib) == Gia_ManCiNum(pGia) );

    // create hash table if not available
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
        Gia_ManHashStart( pGia );

    // add AIG subgraphs
    vSupps = Lms_GiaSuppSizes( pLib );
    Gia_ManForEachCo( pLib, pObjPo, k )
    {
        // get support size
        nLeaves = Vec_StrEntry(vSupps, k);
        assert( nLeaves > 1 );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Gia_ObjComputeTruthTable( pLib, Gia_ObjFanin0(pObjPo) );
p->timeTruth += Abc_Clock() - clk;
        // semi-canonicize
clk = Abc_Clock();
        memcpy( p->pTemp1, pTruth, p->nWords * sizeof(word) );
#ifdef LMS_USE_OLD_FORM
        uCanonPhase = Kit_TruthSemiCanonicize( (unsigned *)p->pTemp1, (unsigned *)p->pTemp2, nLeaves, pCanonPerm );
#else
        uCanonPhase = Abc_TtCanonicize( p->pTemp1, nLeaves, pCanonPerm );
#endif
        Abc_TtStretch5( (unsigned *)p->pTemp1, nLeaves, p->nVars );
p->timeCanon += Abc_Clock() - clk;
        // pCanonPerm and uCanonPhase show what was the variable corresponding to each var in the current truth
        if ( nLeaves == 2 && Abc_TtSupportSize(pTruth, 2) != 2 )
            continue;

clk = Abc_Clock();
        // map cut leaves into elementary variables of GIA
        for ( i = 0; i < nLeaves; i++ )
            Gia_ManCi( pLib, pCanonPerm[i] )->Value = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManPi(pGia, i)), (uCanonPhase >> i) & 1 );
        // build internal nodes
        assert( Vec_IntSize(pLib->vTtNodes) > 0 );
        Gia_ManForEachObjVec( pLib->vTtNodes, pLib, pTemp, i )
        {
            iFanin0 = Abc_LitNotCond( Gia_ObjFanin0(pTemp)->Value, Gia_ObjFaninC0(pTemp) );
            iFanin1 = Abc_LitNotCond( Gia_ObjFanin1(pTemp)->Value, Gia_ObjFaninC1(pTemp) );
            pTemp->Value = Gia_ManHashAnd( pGia, iFanin0, iFanin1 );
        }
p->timeBuild += Abc_Clock() - clk;

        // check if this node is already driving a PO
        assert( Gia_ObjIsAnd(pTemp) );
        pDriver = Gia_ManObj(pGia, Abc_Lit2Var(pTemp->Value));
        if ( pDriver->fMark1 )
        {
            p->nFilterSame++;
            continue;
        }
        pDriver->fMark1 = 1;
        // create output
        Gia_ManAppendCo( pGia, Abc_LitNotCond( pTemp->Value, (uCanonPhase >> nLeaves) & 1 ) );

        // verify truth table
        if ( fCheck )
        {
clk = Abc_Clock();
        pTemp = Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1);
        pTruth = Gia_ObjComputeTruthTable( pGia, Gia_ManCo(pGia, Gia_ManCoNum(pGia)-1) );
p->timeCheck += Abc_Clock() - clk;
        if ( memcmp( p->pTemp1, pTruth, p->nWords * sizeof(word) ) != 0 )
        {
    
            Kit_DsdPrintFromTruth( (unsigned *)pTruth, nLeaves ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned *)p->pTemp1, nLeaves ); printf( "\n" );
            printf( "Truth table verification has failed.\n" );
    
            // drive PO with constant
            Gia_ManPatchCoDriver( pGia, Gia_ManCoNum(pGia)-1, 0 );
            // save truth table ID
            Vec_IntPush( p->vTruthIds, -1 );
            p->nFilterTruth++;
            continue;
        }
        }

clk = Abc_Clock();
        // add the resulting truth table to the hash table 
        Index = Vec_MemHashInsert( p->vTtMem, p->pTemp1 );
        // save truth table ID
        Vec_IntPush( p->vTruthIds, Index );
        assert( Gia_ManCoNum(pGia) == Vec_IntSize(p->vTruthIds) );
        p->nAdded++;
p->timeInsert += Abc_Clock() - clk;
    }
    Vec_StrFree( vSupps );
p->timeTotal += Abc_Clock() - clk2;
}